

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

void secp256k1_ellswift_elligatorswift_var
               (uchar *u32,secp256k1_fe *t,secp256k1_ge *p,secp256k1_sha256 *hasher)

{
  int iVar1;
  int iVar2;
  long in_RDX;
  secp256k1_fe *in_RSI;
  secp256k1_sha256 *in_stack_00000038;
  secp256k1_fe *in_stack_00000040;
  secp256k1_fe *in_stack_00000048;
  uchar *in_stack_00000050;
  
  secp256k1_ellswift_xelligatorswift_var
            (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038);
  secp256k1_fe_impl_normalize_var(in_RSI);
  iVar1 = secp256k1_fe_impl_is_odd(in_RSI);
  iVar2 = secp256k1_fe_impl_is_odd((secp256k1_fe *)(in_RDX + 0x28));
  if (iVar1 != iVar2) {
    secp256k1_fe_impl_negate_unchecked(in_RSI,in_RSI,1);
    secp256k1_fe_impl_normalize_var(in_RSI);
  }
  return;
}

Assistant:

static void secp256k1_ellswift_elligatorswift_var(unsigned char *u32, secp256k1_fe *t, const secp256k1_ge *p, const secp256k1_sha256 *hasher) {
    secp256k1_ellswift_xelligatorswift_var(u32, t, &p->x, hasher);
    secp256k1_fe_normalize_var(t);
    if (secp256k1_fe_is_odd(t) != secp256k1_fe_is_odd(&p->y)) {
        secp256k1_fe_negate(t, t, 1);
        secp256k1_fe_normalize_var(t);
    }
}